

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UdpBodySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpBodySyntax,slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>&,slang::syntax::UdpInitialStmtSyntax*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::UdpEntrySyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *args,
          UdpInitialStmtSyntax **args_1,Token *args_2,
          SyntaxList<slang::syntax::UdpEntrySyntax> *args_3,Token *args_4)

{
  Token endtable;
  UdpBodySyntax *pUVar1;
  SyntaxList<slang::syntax::UdpEntrySyntax> *in_RDI;
  UdpInitialStmtSyntax *unaff_retaddr;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *in_stack_00000008;
  UdpBodySyntax *in_stack_00000010;
  undefined1 in_stack_00000018 [16];
  undefined2 uStack0000000000000030;
  undefined1 uStack0000000000000032;
  undefined1 uStack0000000000000033;
  undefined4 uStack0000000000000034;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pUVar1 = (UdpBodySyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  endtable.info = (Info *)args_4;
  endtable.kind = uStack0000000000000030;
  endtable._2_1_ = uStack0000000000000032;
  endtable.numFlags.raw = uStack0000000000000033;
  endtable.rawLen = uStack0000000000000034;
  slang::syntax::UdpBodySyntax::UdpBodySyntax
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(Token)in_stack_00000018,in_RDI,
             endtable);
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }